

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadPolH_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  int16_t iVar5;
  int32_t iVar6;
  uint uVar7;
  Mesh *this_00;
  __shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *msh_00;
  reference paVar8;
  basic_formatter *this_02;
  size_type sVar9;
  vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *this_03;
  float fVar10;
  undefined1 local_2c8 [24];
  reference local_2b0;
  VertexIndex *v_2;
  ulong local_2a0;
  size_t x;
  size_t num;
  Face *f;
  pointer pVStack_280;
  pointer local_278;
  pointer pVStack_270;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_f0;
  byte local_c9;
  ulong uStack_c8;
  bool hole;
  size_t i;
  size_t numf;
  aiVector2D *v_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *__range1_1;
  aiVector3D *v;
  iterator __end1;
  iterator __begin1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *__range1;
  Mesh *msh;
  shared_ptr<Assimp::COB::Mesh> local_60;
  shared_ptr<Assimp::COB::Node> local_50;
  undefined1 local_40 [8];
  chunk_guard cn;
  ChunkInfo *nfo_local;
  StreamReaderLE *reader_local;
  Scene *out_local;
  COBImporter *this_local;
  
  cn.cur = (long)nfo;
  if (nfo->version < 9) {
    chunk_guard::chunk_guard((chunk_guard *)local_40,nfo,reader);
    this_00 = (Mesh *)operator_new(0x158);
    COB::Mesh::Mesh(this_00);
    std::shared_ptr<Assimp::COB::Mesh>::shared_ptr<Assimp::COB::Mesh,void>(&local_60,this_00);
    std::shared_ptr<Assimp::COB::Node>::shared_ptr<Assimp::COB::Mesh,void>(&local_50,&local_60);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::push_back(&out->nodes,&local_50);
    std::shared_ptr<Assimp::COB::Node>::~shared_ptr(&local_50);
    std::shared_ptr<Assimp::COB::Mesh>::~shared_ptr(&local_60);
    this_01 = &std::
               deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ::back(&out->nodes)->
               super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
    msh_00 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
    uVar1 = *(undefined8 *)cn.cur;
    uVar2 = *(undefined8 *)(cn.cur + 8);
    (msh_00->super_ChunkInfo).id = (int)uVar1;
    (msh_00->super_ChunkInfo).parent_id = (int)((ulong)uVar1 >> 0x20);
    (msh_00->super_ChunkInfo).version = (int)uVar2;
    (msh_00->super_ChunkInfo).size = (int)((ulong)uVar2 >> 0x20);
    ReadBasicNodeInfo_Binary(this,msh_00,reader,(ChunkInfo *)cn.cur);
    iVar6 = StreamReader<false,_false>::GetI4(reader);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&msh_00[1].type,
               (long)iVar6);
    __end1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &msh_00[1].type);
    v = (aiVector3D *)
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&msh_00[1].type
                  );
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                                       *)&v), bVar3) {
      paVar8 = __gnu_cxx::
               __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator*(&__end1);
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      paVar8->x = fVar10;
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      paVar8->y = fVar10;
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      paVar8->z = fVar10;
      __gnu_cxx::
      __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
      ::operator++(&__end1);
    }
    iVar6 = StreamReader<false,_false>::GetI4(reader);
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
              ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(msh_00 + 1),
               (long)iVar6);
    __end1_1 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::begin
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                          (msh_00 + 1));
    v_1 = (aiVector2D *)
          std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::end
                    ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(msh_00 + 1))
    ;
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<aiVector2t<float>_*,_std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>_>
                               *)&v_1), bVar3) {
      numf = (size_t)__gnu_cxx::
                     __normal_iterator<aiVector2t<float>_*,_std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>_>
                     ::operator*(&__end1_1);
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      *(float *)numf = fVar10;
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      *(float *)(numf + 4) = fVar10;
      __gnu_cxx::
      __normal_iterator<aiVector2t<float>_*,_std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>_>
      ::operator++(&__end1_1);
    }
    iVar6 = StreamReader<false,_false>::GetI4(reader);
    i = (size_t)iVar6;
    std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::reserve
              ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)
               &msh_00[1].temp_children.
                super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                ._M_impl.super__Deque_impl_data._M_start,i);
    for (uStack_c8 = 0; uStack_c8 < i; uStack_c8 = uStack_c8 + 1) {
      bVar4 = StreamReader<false,_false>::GetI1(reader);
      local_c9 = (bVar4 & 8) != 0;
      if ((bool)local_c9) {
        bVar3 = std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::empty
                          ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)
                           &msh_00[1].temp_children.
                            super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                            ._M_impl.super__Deque_impl_data._M_start);
        if (bVar3) {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    (&local_268,
                     (char (*) [56])"A hole is the first entity in the `PolH` chunk with id ");
          this_02 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_268,(uint *)cn.cur);
          Formatter::basic_formatter::operator_cast_to_string(&local_f0,this_02);
          ThrowException(&local_f0);
        }
      }
      else {
        local_278 = (pointer)0x0;
        pVStack_270 = (pointer)0x0;
        f = (Face *)0x0;
        pVStack_280 = (pointer)0x0;
        COB::Face::Face((Face *)&f);
        std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::push_back
                  ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)
                   &msh_00[1].temp_children.
                    super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                    ._M_impl.super__Deque_impl_data._M_start,(Face *)&f);
        COB::Face::~Face((Face *)&f);
      }
      num = (size_t)std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::back
                              ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)
                               &msh_00[1].temp_children.
                                super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                ._M_impl.super__Deque_impl_data._M_start);
      iVar5 = StreamReader<false,_false>::GetI2(reader);
      x = (size_t)iVar5;
      this_03 = (vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                (num + 8);
      sVar9 = std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::size
                        (this_03);
      std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::reserve
                (this_03,sVar9 + x);
      if ((local_c9 & 1) == 0) {
        iVar5 = StreamReader<false,_false>::GetI2(reader);
        *(int *)num = (int)iVar5;
        *(undefined4 *)(num + 4) = 0;
      }
      for (local_2a0 = 0; local_2a0 < x; local_2a0 = local_2a0 + 1) {
        v_2 = (VertexIndex *)0x0;
        std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::push_back
                  ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                   (num + 8),(value_type *)&v_2);
        local_2b0 = std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                    ::back((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                            *)(num + 8));
        uVar7 = StreamReader<false,_false>::GetI4(reader);
        local_2b0->pos_idx = uVar7;
        uVar7 = StreamReader<false,_false>::GetI4(reader);
        local_2b0->uv_idx = uVar7;
      }
      if ((local_c9 & 1) != 0) {
        std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::rbegin
                  ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                   (local_2c8 + 0x10));
        std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::rbegin
                  ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                   local_2c8);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>_>
        ::operator+((reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>_>
                     *)(local_2c8 + 8),(difference_type)local_2c8);
        std::
        reverse<std::reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::COB::VertexIndex*,std::vector<Assimp::COB::VertexIndex,std::allocator<Assimp::COB::VertexIndex>>>>>
                  ((reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>_>
                    *)(local_2c8 + 0x10),
                   (reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>_>
                    *)(local_2c8 + 8));
      }
    }
    if (4 < *(uint *)(cn.cur + 8)) {
      iVar6 = StreamReader<false,_false>::GetI4(reader);
      *(int32_t *)
       &msh_00[1].temp_children.
        super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_node = iVar6;
    }
    if ((5 < *(uint *)(cn.cur + 8)) && (*(uint *)(cn.cur + 8) < 8)) {
      StreamReader<false,_false>::GetI4(reader);
    }
    chunk_guard::~chunk_guard((chunk_guard *)local_40);
  }
  else {
    UnsupportedChunk_Binary(this,reader,nfo,"PolH");
  }
  return;
}

Assistant:

void COBImporter::ReadPolH_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Binary(reader,nfo,"PolH");
    }
    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::shared_ptr<Mesh>(new Mesh()));
    Mesh& msh = (Mesh&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);

    msh.vertex_positions.resize(reader.GetI4());
    for(aiVector3D& v : msh.vertex_positions) {
        v.x = reader.GetF4();
        v.y = reader.GetF4();
        v.z = reader.GetF4();
    }

    msh.texture_coords.resize(reader.GetI4());
    for(aiVector2D& v : msh.texture_coords) {
        v.x = reader.GetF4();
        v.y = reader.GetF4();
    }

    const size_t numf = reader.GetI4();
    msh.faces.reserve(numf);
    for(size_t i = 0; i < numf; ++i) {
        // XXX backface culling flag is 0x10 in flags

        // hole?
        bool hole;
        if ((hole = (reader.GetI1() & 0x08) != 0)) {
            // XXX Basically this should just work fine - then triangulator
            // should output properly triangulated data even for polygons
            // with holes. Test data specific to COB is needed to confirm it.
            if (msh.faces.empty()) {
                ThrowException(format("A hole is the first entity in the `PolH` chunk with id ") << nfo.id);
            }
        }
        else msh.faces.push_back(Face());
        Face& f = msh.faces.back();

        const size_t num = reader.GetI2();
        f.indices.reserve(f.indices.size() + num);

        if(!hole) {
            f.material = reader.GetI2();
            f.flags = 0;
        }

        for(size_t x = 0; x < num; ++x) {
            f.indices.push_back(VertexIndex());

            VertexIndex& v = f.indices.back();
            v.pos_idx = reader.GetI4();
            v.uv_idx = reader.GetI4();
        }

        if(hole) {
            std::reverse(f.indices.rbegin(),f.indices.rbegin()+num);
        }
    }
    if (nfo.version>4) {
        msh.draw_flags = reader.GetI4();
    }
    nfo.version>5 && nfo.version<8 ? reader.GetI4() : 0;
}